

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_decimal.hpp
# Opt level: O2

bool duckdb::ToCDecimalCastWrapper<duckdb::hugeint_t>::Operation<double>
               (double input,duckdb_decimal *result,CastParameters *parameters,uint8_t width,
               uint8_t scale)

{
  bool bVar1;
  hugeint_t intermediate_result;
  hugeint_t local_48;
  undefined8 local_38;
  uint64_t uStack_30;
  int64_t local_28;
  
  bVar1 = TryCastToDecimal::Operation<double,duckdb::hugeint_t>
                    (input,&local_48,parameters,width,scale);
  if (bVar1) {
    result->scale = scale;
    result->width = width;
    (result->value).lower = local_48.lower;
    (result->value).upper = local_48.upper;
  }
  else {
    FetchDefaultValue::Operation<duckdb_decimal>();
    (result->value).upper = local_28;
    result->width = (undefined1)local_38;
    result->scale = local_38._1_1_;
    *(undefined6 *)&result->field_0x2 = local_38._2_6_;
    (result->value).lower = uStack_30;
  }
  return bVar1;
}

Assistant:

static bool Operation(SOURCE_TYPE input, duckdb_decimal &result, CastParameters &parameters, uint8_t width,
	                      uint8_t scale) {
		hugeint_t intermediate_result;

		if (!TryCastToDecimal::Operation<SOURCE_TYPE, hugeint_t>(input, intermediate_result, parameters, width,
		                                                         scale)) {
			result = FetchDefaultValue::Operation<duckdb_decimal>();
			return false;
		}
		result.scale = scale;
		result.width = width;

		duckdb_hugeint hugeint_value;
		hugeint_value.upper = intermediate_result.upper;
		hugeint_value.lower = intermediate_result.lower;
		result.value = hugeint_value;
		return true;
	}